

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

bool tchecker::is_initial(clockval_t *clockval)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = (clockval->super_clock_value_array_t).super_clockval_base_t.
          super_array_capacity_t<unsigned_short>._capacity;
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    uVar2 = 0;
    do {
      if (uVar1 == (ushort)uVar2) {
        __assert_fail("i < BASE::_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                      ,0xfd,
                      "const T &tchecker::make_array_t<boost::rational<long>, 16, tchecker::clockval_base_t>::operator[](typename BASE::capacity_t) const [T = boost::rational<long>, T_ALLOCSIZE = 16, BASE = tchecker::clockval_base_t]"
                     );
      }
      uVar3 = (ulong)((uVar2 & 0xffff) << 4);
      if (*(long *)((long)&clockval[1].super_clock_value_array_t.super_clockval_base_t.
                           super_array_capacity_t<unsigned_short>._capacity + uVar3) != 1) {
        return bVar4;
      }
      if (*(long *)(&(clockval->super_clock_value_array_t)._fam.field_0x0 + uVar3) != 0) {
        return bVar4;
      }
      uVar2 = uVar2 + 1;
      bVar4 = uVar1 <= uVar2;
    } while (uVar2 != uVar1);
  }
  return bVar4;
}

Assistant:

bool is_initial(tchecker::clockval_t const & clockval)
{
  for (tchecker::clock_id_t id = 0; id < clockval.size(); ++id)
    if (clockval[id] != 0)
      return false;
  return true;
}